

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsbMan.c
# Opt level: O1

Rsb_Man_t * Rsb_ManAlloc(int nLeafMax,int nDivMax,int nDecMax,int fVerbose)

{
  Rsb_Man_t *pRVar1;
  Vec_Wrd_t *pVVar2;
  word *pwVar3;
  Vec_Int_t *pVVar4;
  int *piVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  
  if (0x14 < nLeafMax) {
    __assert_fail("nLeafMax <= 20",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/rsb/rsbMan.c"
                  ,0x30,"Rsb_Man_t *Rsb_ManAlloc(int, int, int, int)");
  }
  if (nDivMax < 0xc9) {
    pRVar1 = (Rsb_Man_t *)calloc(1,0x38);
    pRVar1->nLeafMax = nLeafMax;
    pRVar1->nDivMax = nDivMax;
    pRVar1->nDecMax = nDecMax;
    pRVar1->fVerbose = fVerbose;
    iVar6 = nDivMax + 0x96;
    pVVar2 = (Vec_Wrd_t *)malloc(0x10);
    if (nDivMax + 0x95U < 0xf) {
      iVar6 = 0x10;
    }
    pVVar2->nSize = 0;
    pVVar2->nCap = iVar6;
    if (iVar6 == 0) {
      pwVar3 = (word *)0x0;
    }
    else {
      pwVar3 = (word *)malloc((long)iVar6 << 3);
    }
    pVVar2->pArray = pwVar3;
    uVar7 = 1 << ((char)nLeafMax - 6U & 0x1f);
    pRVar1->vCexes = pVVar2;
    if (uVar7 < 0x11) {
      uVar7 = 0x10;
    }
    uVar8 = (ulong)uVar7;
    pVVar4 = (Vec_Int_t *)malloc(0x10);
    if (nLeafMax < 7) {
      uVar8 = 0x10;
    }
    pVVar4->nSize = 0;
    pVVar4->nCap = (int)uVar8;
    piVar5 = (int *)malloc(uVar8 << 2);
    pVVar4->pArray = piVar5;
    pRVar1->vDecPats = pVVar4;
    pVVar4 = (Vec_Int_t *)malloc(0x10);
    pVVar4->nCap = 0x10;
    pVVar4->nSize = 0;
    piVar5 = (int *)malloc(0x40);
    pVVar4->pArray = piVar5;
    pRVar1->vFanins = pVVar4;
    pVVar4 = (Vec_Int_t *)malloc(0x10);
    pVVar4->nCap = 0x10;
    pVVar4->nSize = 0;
    piVar5 = (int *)malloc(0x40);
    pVVar4->pArray = piVar5;
    pRVar1->vFaninsOld = pVVar4;
    pVVar4 = (Vec_Int_t *)malloc(0x10);
    pVVar4->nCap = 0x10;
    pVVar4->nSize = 0;
    piVar5 = (int *)malloc(0x40);
    pVVar4->pArray = piVar5;
    pRVar1->vTries = pVVar4;
    return pRVar1;
  }
  __assert_fail("nDivMax <= 200",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/rsb/rsbMan.c"
                ,0x31,"Rsb_Man_t *Rsb_ManAlloc(int, int, int, int)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Rsb_Man_t * Rsb_ManAlloc( int nLeafMax, int nDivMax, int nDecMax, int fVerbose )
{
    Rsb_Man_t * p;
    assert( nLeafMax <= 20 );
    assert( nDivMax  <= 200 );
    p = ABC_CALLOC( Rsb_Man_t, 1 );
    p->nLeafMax   = nLeafMax;
    p->nDivMax    = nDivMax;
    p->nDecMax    = nDecMax;
    p->fVerbose   = fVerbose;
    // decomposition
    p->vCexes     = Vec_WrdAlloc( nDivMax + 150 );
    p->vDecPats   = Vec_IntAlloc( Abc_TtWordNum(nLeafMax) );
    p->vFanins    = Vec_IntAlloc( 10 );
    p->vFaninsOld = Vec_IntAlloc( 10 );
    p->vTries     = Vec_IntAlloc( 10 );
    return p;
}